

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void array_bitset_container_andnot
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint16_t *puVar4;
  uint64_t *puVar5;
  uint uVar6;
  long lVar7;
  
  if (dst->capacity < src_1->cardinality) {
    array_container_grow(dst,src_1->cardinality,false);
  }
  iVar2 = src_1->cardinality;
  if ((long)iVar2 < 1) {
    uVar6 = 0;
  }
  else {
    puVar3 = src_1->array;
    puVar4 = dst->array;
    puVar5 = src_2->words;
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar1 = puVar3[lVar7];
      puVar4[uVar6] = uVar1;
      uVar6 = (uVar6 + 1) - (uint)((puVar5[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0);
      lVar7 = lVar7 + 1;
    } while (iVar2 != lVar7);
  }
  dst->cardinality = uVar6;
  return;
}

Assistant:

void array_bitset_container_andnot(const array_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   array_container_t *dst) {
    // follows Java implementation as of June 2016
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        dst->array[newcard] = key;
        newcard += 1 - bitset_container_contains(src_2, key);
    }
    dst->cardinality = newcard;
}